

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::DimensionSpecifierSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != QueueDimensionSpecifier) && (kind != RangeDimensionSpecifier)) &&
     (kind != WildcardDimensionSpecifier)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DimensionSpecifierSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::QueueDimensionSpecifier:
        case SyntaxKind::RangeDimensionSpecifier:
        case SyntaxKind::WildcardDimensionSpecifier:
            return true;
        default:
            return false;
    }
}